

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

void __thiscall llbuild::core::BuildEngine::resetForBuild(BuildEngine *this)

{
  pthread_mutex_t *__mutex;
  void *pvVar1;
  int iVar2;
  
  pvVar1 = this->impl;
  __mutex = (pthread_mutex_t *)((long)pvVar1 + 0x90);
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    LOCK();
    *(undefined1 *)((long)pvVar1 + 200) = 0;
    UNLOCK();
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void BuildEngine::resetForBuild() {
  static_cast<BuildEngineImpl*>(impl)->resetForBuild();
}